

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-history.c
# Opt level: O2

void dump_history(ang_file *file)

{
  _Bool _Var1;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  history_info *history_list_local;
  char buf [120];
  
  history_list_local = (history_info *)0x0;
  sVar2 = history_get_list(player,&history_list_local);
  file_putf(file,"[Player history]\n");
  file_putf(file,"      Turn   Depth  Note\n");
  lVar3 = 0xc;
  while (bVar4 = sVar2 != 0, sVar2 = sVar2 - 1, bVar4) {
    strnfmt(buf,0x78,"%10ld%7d\'  %s",(long)*(int *)(history_list_local->type + lVar3 + -4),
            (ulong)(uint)(*(short *)(history_list_local->type + lVar3 + -10) * 0x32),
            history_list_local->type + lVar3);
    _Var1 = flag_has_dbg(history_list_local->type + lVar3 + -0xc,2,4,"history_list_local[i].type",
                         "HIST_ARTIFACT_LOST");
    if (_Var1) {
      my_strcat(buf," (LOST)",0x78);
    }
    file_putf(file,"%s",buf);
    file_put(file,"\n");
    lVar3 = lVar3 + 0x5c;
  }
  return;
}

Assistant:

void dump_history(ang_file *file)
{
	struct history_info *history_list_local = NULL;
	size_t max_item = history_get_list(player, &history_list_local);
	size_t i;
	char buf[120];

	file_putf(file, "[Player history]\n");
	file_putf(file, "      Turn   Depth  Note\n");

	for (i = 0; i < max_item; i++) {
		strnfmt(buf, sizeof(buf), "%10ld%7d\'  %s",
				(long)history_list_local[i].turn,
				history_list_local[i].dlev * 50,
				history_list_local[i].event);

		if (hist_has(history_list_local[i].type, HIST_ARTIFACT_LOST))
			my_strcat(buf, " (LOST)", sizeof(buf));

		file_putf(file, "%s", buf);
		file_put(file, "\n");
	}

	return;
}